

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

Section * __thiscall
asmjit::v1_14::CodeHolder::sectionByName(CodeHolder *this,char *name,size_t nameSize)

{
  uint uVar1;
  long lVar2;
  Section *pSVar3;
  int iVar4;
  ulong in_RDX;
  char *in_RSI;
  long in_RDI;
  Section *section;
  const_iterator __end3;
  const_iterator __begin3;
  ZoneVector<asmjit::v1_14::Section_*> *__range3;
  long *local_50;
  ulong local_40;
  
  local_40 = in_RDX;
  if (in_RDX == 0xffffffffffffffff) {
    local_40 = strlen(in_RSI);
  }
  if (local_40 < 0x24) {
    lVar2 = *(long *)(in_RDI + 0xd8);
    uVar1 = *(uint *)(in_RDI + 0xe0);
    for (local_50 = *(long **)(in_RDI + 0xd8); local_50 != (long *)(lVar2 + (ulong)uVar1 * 8);
        local_50 = local_50 + 1) {
      pSVar3 = (Section *)*local_50;
      iVar4 = memcmp(&pSVar3->_name,in_RSI,local_40);
      if ((iVar4 == 0) && ((pSVar3->_name).str[local_40] == '\0')) {
        return pSVar3;
      }
    }
  }
  return (Section *)0x0;
}

Assistant:

Section* CodeHolder::sectionByName(const char* name, size_t nameSize) const noexcept {
  if (nameSize == SIZE_MAX)
    nameSize = strlen(name);

  // This could be also put in a hash-table similarly like we do with labels,
  // however it's questionable as the number of sections should be pretty low
  // in general. Create an issue if this becomes a problem.
  if (nameSize <= Globals::kMaxSectionNameSize) {
    for (Section* section : _sections)
      if (memcmp(section->_name.str, name, nameSize) == 0 && section->_name.str[nameSize] == '\0')
        return section;
  }

  return nullptr;
}